

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManComputeBackward3(Of_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  Of_Obj_t *pOVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Gia_Obj_t *pObj;
  int *piVar9;
  int iVar10;
  uint v;
  uint *pCut;
  int iVar11;
  uint *pCut_00;
  
  iVar1 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  pJVar2 = p->pPars;
  pJVar2->Area = 0;
  pJVar2->Edge = 0;
  v = p->pGia->nObjs;
  while( true ) {
    if ((int)v < 2) {
      return;
    }
    v = v - 1;
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar6 = (uint)*(undefined8 *)pObj;
    if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
      pOVar3 = p->pObjs;
      iVar10 = pOVar3[v].Required;
      iVar4 = Gia_ObjIsBuf(pObj);
      if (iVar4 == 0) {
        if (pOVar3[v].nRefs != 0) {
          piVar9 = Of_ObjCutBestP(p,v);
          iVar5 = Of_CutDeref_rec(p,piVar9);
          piVar9 = Of_ObjCutSet(p,v);
          pCut = (uint *)(piVar9 + 1);
          pCut_00 = (uint *)0x0;
          iVar4 = 1000000000;
          for (iVar11 = 0; iVar11 < *piVar9; iVar11 = iVar11 + 1) {
            uVar6 = *pCut & 0x1f;
            if ((int)pCut[(ulong)uVar6 + 1] <= iVar10) {
              iVar7 = Of_CutAreaDerefed2(p,(int *)pCut);
              if (iVar7 < iVar4) {
                pCut_00 = pCut;
              }
              if (iVar7 <= iVar4) {
                iVar4 = iVar7;
              }
              uVar6 = *pCut & 0x1f;
            }
            pCut = pCut + (ulong)uVar6 + 4;
          }
          if (pCut_00 == (uint *)0x0) {
            __assert_fail("pCutMin != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                          ,0x500,"void Of_ManComputeBackward3(Of_Man_t *)");
          }
          Of_ObjSetCutBestP(p,piVar9,v,(int *)pCut_00);
          iVar10 = iVar10 - iVar1;
          uVar6 = 0;
          while ((uVar6 < (*pCut_00 & 0x1f) && (uVar8 = Of_CutVar((int *)pCut_00,uVar6), uVar8 != 0)
                 )) {
            if (iVar10 < p->pObjs[uVar8].Required) {
              p->pObjs[uVar8].Required = iVar10;
            }
            uVar6 = uVar6 + 1;
          }
          iVar10 = Of_CutRef_rec(p,(int *)pCut_00);
          if (iVar5 < iVar10) {
            __assert_fail("AreaAft <= AreaBef",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                          ,0x506,"void Of_ManComputeBackward3(Of_Man_t *)");
          }
          uVar6 = *pCut_00;
          pJVar2 = p->pPars;
          pJVar2->Area = pJVar2->Area + 1;
          pJVar2->Edge = (ulong)(uVar6 & 0x1f) + pJVar2->Edge;
        }
      }
      else {
        iVar4 = v - (uVar6 & 0x1fffffff);
        if (iVar10 < pOVar3[iVar4].Required) {
          pOVar3[iVar4].Required = iVar10;
        }
      }
    }
  }
  return;
}

Assistant:

void Of_ManComputeBackward3( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    int AreaBef = 0, AreaAft = 0;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // deref best cut
        AreaBef = Of_CutDeref_rec( p, Of_ObjCutBestP(p, i) );        
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_CutAreaDerefed2( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // ref best cut
        AreaAft = Of_CutRef_rec( p, pCutMin );
        assert( AreaAft <= AreaBef );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}